

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_diag_avx2_256_64.c
# Opt level: O2

parasail_result_t *
parasail_sw_diag_avx2_256_64
          (char *_s1,int _s1Len,char *_s2,int s2Len,int open,int gap,parasail_matrix_t *matrix)

{
  int64_t iVar1;
  int *piVar2;
  __m256i *palVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  ulong uVar6;
  __m256i a;
  __m256i a_00;
  __m256i a_01;
  __m256i a_02;
  __m256i a_03;
  __m256i a_04;
  __m256i b;
  __m256i b_00;
  __m256i b_01;
  __m256i b_02;
  __m256i b_03;
  __m256i b_04;
  parasail_result_t *ppVar7;
  int64_t *ptr;
  int64_t *piVar8;
  int64_t *ptr_00;
  uint uVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar14;
  uint uVar15;
  long lVar16;
  ulong uVar18;
  ulong uVar19;
  char *__format;
  __m256i *__return_storage_ptr__;
  uint uVar20;
  int iVar21;
  long lVar22;
  int64_t iVar23;
  ulong uVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [16];
  undefined1 auVar37 [32];
  undefined1 auVar38 [64];
  undefined1 auVar39 [32];
  undefined1 in_ZMM6 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [32];
  undefined1 in_stack_fffffffffffffc40 [16];
  int64_t *ptr_01;
  uint uVar43;
  int64_t *ptr_02;
  undefined1 local_2c0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_1e0 [32];
  long local_1c0;
  long lStack_1b8;
  long lStack_1b0;
  long lStack_1a8;
  undefined1 local_1a0 [32];
  undefined1 local_180 [32];
  undefined1 local_160 [32];
  long local_140;
  long lStack_138;
  long lStack_130;
  long lStack_128;
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [2] [32];
  int64_t iVar13;
  int64_t iVar17;
  
  if (_s2 == (char *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "_s2";
  }
  else if (s2Len < 1) {
    __format = "%s: %s must be > 0\n";
    pcVar14 = "s2Len";
  }
  else if (open < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar14 = "open";
  }
  else if (gap < 0) {
    __format = "%s: %s must be >= 0\n";
    pcVar14 = "gap";
  }
  else if (matrix == (parasail_matrix_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar14 = "matrix";
  }
  else {
    if (matrix->type != 0) {
      _s1Len = matrix->length;
LAB_0070f584:
      iVar10 = matrix->min;
      uVar6 = CONCAT44(0,open);
      uVar12 = 0x8000000000000000 - (long)iVar10;
      if (iVar10 != -open && SBORROW4(iVar10,-open) == iVar10 + open < 0) {
        uVar12 = uVar6 | 0x8000000000000000;
      }
      iVar10 = matrix->max;
      ppVar7 = parasail_result_new();
      if (ppVar7 != (parasail_result_t *)0x0) {
        ppVar7->flag = ppVar7->flag | 0x4801004;
        uVar18 = (ulong)(s2Len + 6);
        ptr = parasail_memalign_int64_t(0x20,uVar18);
        piVar8 = parasail_memalign_int64_t(0x20,uVar18);
        ptr_00 = parasail_memalign_int64_t(0x20,uVar18);
        if (ptr_00 != (int64_t *)0x0 && (piVar8 != (int64_t *)0x0 && ptr != (int64_t *)0x0)) {
          lVar11 = (long)_s1Len;
          uVar43 = _s1Len;
          if (matrix->type == 0) {
            ptr_01 = parasail_memalign_int64_t(0x20,(long)(int)(_s1Len + 3));
            if (ptr_01 == (int64_t *)0x0) {
              return (parasail_result_t *)0x0;
            }
            for (uVar18 = 0; lVar22 = lVar11, (uint)(~(_s1Len >> 0x1f) & _s1Len) != uVar18;
                uVar18 = uVar18 + 1) {
              ptr_01[uVar18] = (long)matrix->mapper[(byte)_s1[uVar18]];
            }
            for (; lVar22 < (int)(_s1Len + 3); lVar22 = lVar22 + 1) {
              ptr_01[lVar22] = 0;
            }
          }
          else {
            ptr_01 = (int64_t *)0x0;
          }
          uVar20 = s2Len + 3;
          lVar22 = uVar12 + 1;
          local_1c0 = 0x7ffffffffffffffe - (long)iVar10;
          auVar33._8_8_ = lVar22;
          auVar33._0_8_ = lVar22;
          auVar33._16_8_ = lVar22;
          auVar33._24_8_ = lVar22;
          lStack_1b8 = local_1c0;
          lStack_1b0 = local_1c0;
          lStack_1a8 = local_1c0;
          local_120 = vpblendd_avx2(auVar33,SUB6432(ZEXT1664((undefined1  [16])0x0),0),0xc0);
          auVar26._4_4_ = 0;
          auVar26._0_4_ = gap;
          auVar26._8_4_ = gap;
          auVar26._12_4_ = 0;
          auVar26._16_4_ = gap;
          auVar26._20_4_ = 0;
          auVar26._24_4_ = gap;
          auVar26._28_4_ = 0;
          local_140 = lVar11;
          lStack_138 = lVar11;
          lStack_130 = lVar11;
          lStack_128 = lVar11;
          uVar12 = CONCAT44(0,s2Len);
          local_e0._8_4_ = s2Len;
          local_e0._0_8_ = uVar12;
          local_e0._12_4_ = 0;
          local_e0._16_4_ = s2Len;
          local_e0._20_4_ = 0;
          local_e0._24_4_ = s2Len;
          local_e0._28_4_ = 0;
          piVar2 = matrix->mapper;
          for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
            ptr[uVar18 + 3] = (long)piVar2[(byte)_s2[uVar18]];
          }
          for (lVar16 = 0; uVar18 = uVar12, lVar16 != 3; lVar16 = lVar16 + 1) {
            ptr[lVar16] = 0;
          }
          for (; (int)uVar18 < (int)uVar20; uVar18 = uVar18 + 1) {
            ptr[uVar18 + 3] = 0;
          }
          for (uVar18 = 0; uVar12 != uVar18; uVar18 = uVar18 + 1) {
            piVar8[uVar18 + 3] = 0;
            ptr_00[uVar18 + 3] = lVar22;
          }
          for (lVar16 = 0; lVar16 != 3; lVar16 = lVar16 + 1) {
            piVar8[lVar16] = lVar22;
            ptr_00[lVar16] = lVar22;
          }
          for (; (int)uVar12 < (int)uVar20; uVar12 = uVar12 + 1) {
            piVar8[uVar12 + 3] = lVar22;
            ptr_00[uVar12 + 3] = lVar22;
          }
          uVar12 = (ulong)(uVar43 - 1);
          local_2c0._8_8_ = 2;
          local_2c0._0_8_ = 3;
          local_2c0._16_8_ = 1;
          local_2c0._24_8_ = 0;
          auVar38 = ZEXT3264(auVar33);
          auVar40 = ZEXT3264(auVar33);
          auVar41 = ZEXT3264(auVar33);
          local_260._8_8_ = local_1c0;
          local_260._0_8_ = local_1c0;
          local_260._16_8_ = local_1c0;
          local_260._24_8_ = local_1c0;
          ptr_02 = piVar8;
          local_280 = auVar33;
          for (uVar18 = 0; (long)uVar18 < lVar11; uVar18 = uVar18 + 4) {
            if (matrix->type == 0) {
              uVar19 = ptr_01[uVar18];
              iVar13 = ptr_01[uVar18 + 1];
              iVar23 = ptr_01[uVar18 | 2];
              iVar17 = ptr_01[uVar18 + 3];
            }
            else {
              uVar15 = (uint)uVar18;
              uVar43 = (uint)uVar12;
              uVar9 = uVar15 | 1;
              if (lVar11 <= (long)(uVar18 | 1)) {
                uVar9 = uVar43;
              }
              iVar13 = (int64_t)(int)uVar9;
              uVar9 = uVar15 | 2;
              if (lVar11 <= (long)(uVar18 | 2)) {
                uVar9 = uVar43;
              }
              iVar23 = (int64_t)(int)uVar9;
              uVar15 = uVar15 | 3;
              if (lVar11 <= (long)(uVar18 | 3)) {
                uVar15 = uVar43;
              }
              iVar17 = (int64_t)(int)uVar15;
              uVar19 = uVar18;
            }
            palVar3 = (__m256i *)matrix->matrix;
            lVar16 = (long)matrix->size;
            auVar27._8_8_ = lStack_138;
            auVar27._0_8_ = local_140;
            auVar27._16_8_ = lStack_130;
            auVar27._24_8_ = lStack_128;
            local_c0 = vpcmpgtq_avx2(auVar27,local_2c0);
            uVar24 = 0;
            auVar5 = vpmovsxbq_avx2(ZEXT416(0xfffefd));
            __return_storage_ptr__ = palVar3;
            auVar42 = local_120;
            auVar29 = auVar33;
            auVar27 = auVar33;
            auVar30 = local_120;
            for (; auVar39 = in_ZMM6._0_32_, (~((int)uVar20 >> 0x1f) & uVar20) != uVar24;
                uVar24 = uVar24 + 1) {
              local_1a0 = auVar41._0_32_;
              local_180 = auVar40._0_32_;
              auVar28 = vpermq_avx2(auVar30,0xf9);
              iVar1 = piVar8[uVar24 + 3];
              auVar34._8_8_ = iVar1;
              auVar34._0_8_ = iVar1;
              auVar34._16_8_ = iVar1;
              auVar34._24_8_ = iVar1;
              local_a0 = vpblendd_avx2(auVar28,auVar34,0xc0);
              auVar27 = vpermq_avx2(auVar27,0xf9);
              iVar1 = ptr_00[uVar24 + 3];
              auVar35._8_8_ = iVar1;
              auVar35._0_8_ = iVar1;
              auVar35._16_8_ = iVar1;
              auVar35._24_8_ = iVar1;
              auVar28 = vpblendd_avx2(auVar27,auVar35,0xc0);
              auVar4._8_4_ = open;
              auVar4._0_8_ = uVar6;
              auVar4._12_4_ = 0;
              auVar4._16_4_ = open;
              auVar4._20_4_ = 0;
              auVar4._24_4_ = open;
              auVar4._28_4_ = 0;
              auVar27 = vpsubq_avx2(local_a0,auVar4);
              vpsubq_avx2(auVar28,auVar26);
              a[2] = (longlong)ptr_01;
              a[0] = in_stack_fffffffffffffc40._0_8_;
              a[1] = in_stack_fffffffffffffc40._8_8_;
              a[3] = uVar12;
              b[1] = lVar11;
              b[0] = lVar22;
              b[2] = (longlong)ppVar7;
              b[3] = (longlong)ptr_02;
              _mm256_max_epi64_rpl(__return_storage_ptr__,a,b);
              auVar28._8_4_ = open;
              auVar28._0_8_ = uVar6;
              auVar28._12_4_ = 0;
              auVar28._16_4_ = open;
              auVar28._20_4_ = 0;
              auVar28._24_4_ = open;
              auVar28._28_4_ = 0;
              auVar28 = vpsubq_avx2(auVar30,auVar28);
              vpsubq_avx2(auVar29,auVar26);
              a_00[2] = (longlong)ptr_01;
              a_00[0] = in_stack_fffffffffffffc40._0_8_;
              a_00[1] = in_stack_fffffffffffffc40._8_8_;
              a_00[3] = uVar12;
              b_00[1] = lVar11;
              b_00[0] = lVar22;
              b_00[2] = (longlong)ppVar7;
              b_00[3] = (longlong)ptr_02;
              _mm256_max_epi64_rpl(__return_storage_ptr__,a_00,b_00);
              auVar25._8_8_ = 0;
              auVar25._0_8_ =
                   (long)*(int *)((long)*palVar3 + ptr[uVar24 + 3] * 4 + uVar19 * lVar16 * 4);
              auVar31._8_8_ = 0;
              auVar31._0_8_ =
                   (long)*(int *)((long)*palVar3 + ptr[uVar24 + 2] * 4 + iVar13 * lVar16 * 4);
              auVar25 = vpunpcklqdq_avx(auVar31,auVar25);
              auVar32._8_8_ = 0;
              auVar32._0_8_ =
                   (long)*(int *)((long)*palVar3 + ptr[uVar24 + 1] * 4 + iVar23 * lVar16 * 4);
              auVar36._8_8_ = 0;
              auVar36._0_8_ = (long)*(int *)((long)*palVar3 + ptr[uVar24] * 4 + iVar17 * lVar16 * 4)
              ;
              auVar31 = vpunpcklqdq_avx(auVar36,auVar32);
              auVar29._0_16_ = ZEXT116(0) * auVar25 + ZEXT116(1) * auVar31;
              auVar29._16_16_ = ZEXT116(1) * auVar25;
              auVar29 = vpaddq_avx2(auVar29,auVar42);
              a_01[2] = (longlong)ptr_01;
              a_01[0] = in_stack_fffffffffffffc40._0_8_;
              a_01[1] = in_stack_fffffffffffffc40._8_8_;
              a_01[3] = uVar12;
              b_01[1] = lVar11;
              b_01[0] = lVar22;
              b_01[2] = (longlong)ppVar7;
              b_01[3] = (longlong)ptr_02;
              _mm256_max_epi64_rpl(__return_storage_ptr__,a_01,b_01);
              a_02[2] = (longlong)ptr_01;
              a_02[0] = in_stack_fffffffffffffc40._0_8_;
              a_02[1] = in_stack_fffffffffffffc40._8_8_;
              a_02[3] = uVar12;
              b_02[1] = lVar11;
              b_02[0] = lVar22;
              b_02[2] = (longlong)ppVar7;
              b_02[3] = (longlong)ptr_02;
              _mm256_max_epi64_rpl(__return_storage_ptr__,a_02,b_02);
              a_03[2] = (longlong)ptr_01;
              a_03[0] = in_stack_fffffffffffffc40._0_8_;
              a_03[1] = in_stack_fffffffffffffc40._8_8_;
              a_03[3] = uVar12;
              b_03[1] = lVar11;
              b_03[0] = lVar22;
              b_03[2] = (longlong)ppVar7;
              b_03[3] = (longlong)ptr_02;
              _mm256_max_epi64_rpl(__return_storage_ptr__,a_03,b_03);
              auVar42._0_8_ = -(ulong)(auVar5._0_8_ == -1);
              auVar42._8_8_ = -(ulong)(auVar5._8_8_ == -1);
              auVar42._16_8_ = -(ulong)(auVar5._16_8_ == -1);
              auVar42._24_8_ = -(ulong)(auVar5._24_8_ == -1);
              auVar30 = vpandn_avx2(auVar42,auVar29);
              auVar27 = vblendvpd_avx(auVar27,auVar33,auVar42);
              piVar8 = ptr_02;
              if (3 < uVar24) {
                auVar4 = vpcmpgtq_avx2(auVar30,local_260);
                local_260 = vblendvpd_avx(auVar30,local_260,auVar4);
                a_04[2] = (longlong)ptr_01;
                a_04[0] = in_stack_fffffffffffffc40._0_8_;
                a_04[1] = in_stack_fffffffffffffc40._8_8_;
                a_04[3] = uVar12;
                b_04[1] = lVar11;
                b_04[0] = lVar22;
                b_04[2] = (longlong)ppVar7;
                b_04[3] = (longlong)ptr_02;
                local_100 = auVar29;
                _mm256_max_epi64_rpl(__return_storage_ptr__,a_04,b_04);
                auVar29 = local_100;
                piVar8 = ptr_02;
              }
              auVar34 = vpcmpeqd_avx2(auVar39,auVar39);
              in_ZMM6 = ZEXT3264(auVar34);
              auVar4 = vpcmpgtq_avx2(auVar5,auVar34);
              auVar39 = vpcmpgtq_avx2(local_e0,auVar5);
              auVar39 = vpand_avx2(auVar39,local_c0);
              auVar39 = vpand_avx2(auVar39,auVar4);
              auVar25 = vpackssdw_avx(auVar39._0_16_,auVar39._16_16_);
              auVar37._0_8_ = -(ulong)(auVar30._0_8_ == local_1a0._0_8_);
              auVar37._8_8_ = -(ulong)(auVar30._8_8_ == local_1a0._8_8_);
              auVar37._16_8_ = -(ulong)(auVar30._16_8_ == local_1a0._16_8_);
              auVar37._24_8_ = -(ulong)(auVar30._24_8_ == local_1a0._24_8_);
              auVar35 = vpcmpgtq_avx2(auVar30,local_1a0);
              auVar4 = vpand_avx2(auVar35,auVar39);
              auVar29 = vblendvpd_avx(local_1a0,auVar29,auVar4);
              auVar41 = ZEXT3264(auVar29);
              auVar31 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
              auVar29 = vpcmpgtq_avx2(local_180,auVar5);
              auVar4 = vpand_avx2(auVar37,auVar29);
              auVar32 = vpackssdw_avx(auVar4._0_16_,auVar4._16_16_);
              auVar25 = vblendvps_avx(auVar31,auVar25,auVar32);
              auVar29 = vblendvpd_avx(auVar28,auVar33,auVar42);
              auVar42 = vpmovsxdq_avx2(auVar25);
              auVar42 = vblendvpd_avx(auVar38._0_32_,local_2c0,auVar42);
              auVar38 = ZEXT3264(auVar42);
              auVar42 = vpor_avx2(auVar4,auVar35);
              auVar42 = vpand_avx2(auVar39,auVar42);
              auVar42 = vblendvpd_avx(local_180,auVar5,auVar42);
              auVar40 = ZEXT3264(auVar42);
              piVar8[uVar24] = auVar30._0_8_;
              iVar1 = vmovlpd_avx(auVar27._0_16_);
              ptr_00[uVar24] = iVar1;
              auVar5 = vpsubq_avx2(auVar5,auVar34);
              auVar42 = local_a0;
              ptr_02 = piVar8;
            }
            auVar30._8_8_ = 4;
            auVar30._0_8_ = 4;
            auVar30._16_8_ = 4;
            auVar30._24_8_ = 4;
            local_2c0 = vpaddq_avx2(local_2c0,auVar30);
          }
          local_80[0] = auVar41._0_32_;
          local_160 = auVar40._0_32_;
          local_1e0 = auVar38._0_32_;
          iVar21 = 0;
          iVar10 = 0;
          for (lVar11 = 0; (int)lVar11 != 4; lVar11 = lVar11 + 1) {
            lVar16 = *(long *)(local_80[0] + lVar11 * 8);
            if (lVar22 < lVar16) {
              iVar10 = *(int *)(local_1e0 + lVar11 * 8);
              lVar22 = lVar16;
              iVar21 = *(int *)(local_160 + lVar11 * 8);
            }
            else if (lVar16 == lVar22) {
              lVar16 = *(long *)(local_160 + lVar11 * 8);
              if (lVar16 < iVar21) {
                iVar10 = *(int *)(local_1e0 + lVar11 * 8);
                iVar21 = (int)lVar16;
              }
              else if ((lVar16 == iVar21) && (*(long *)(local_1e0 + lVar11 * 8) < (long)iVar10)) {
                iVar10 = (int)*(long *)(local_1e0 + lVar11 * 8);
                iVar21 = (int)lVar16;
              }
            }
          }
          auVar26 = vpcmpgtq_avx2(auVar33,local_260);
          auVar5._8_8_ = lStack_1b8;
          auVar5._0_8_ = local_1c0;
          auVar5._16_8_ = lStack_1b0;
          auVar5._24_8_ = lStack_1a8;
          auVar33 = vpcmpgtq_avx2(local_280,auVar5);
          auVar26 = vpor_avx2(auVar26,auVar33);
          if ((((auVar26 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               SUB321(auVar26 >> 0x7f,0) != '\0') || SUB321(auVar26 >> 0xbf,0) != '\0') ||
              auVar26[0x1f] < '\0') {
            *(byte *)&ppVar7->flag = (byte)ppVar7->flag | 0x40;
            lVar22 = 0;
            iVar21 = 0;
            iVar10 = 0;
          }
          ppVar7->score = (int)lVar22;
          ppVar7->end_query = iVar10;
          ppVar7->end_ref = iVar21;
          parasail_free(ptr_00);
          parasail_free(ptr_02);
          parasail_free(ptr);
          if (matrix->type == 0) {
            parasail_free(ptr_01);
            return ppVar7;
          }
          return ppVar7;
        }
      }
      return (parasail_result_t *)0x0;
    }
    if (_s1 == (char *)0x0) {
      __format = "%s: missing %s\n";
      pcVar14 = "_s1";
    }
    else {
      if (0 < _s1Len) goto LAB_0070f584;
      __format = "%s: %s must be > 0\n";
      pcVar14 = "_s1Len";
    }
  }
  fprintf(_stderr,__format,"parasail_sw_diag_avx2_256_64",pcVar14);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* FNAME(
        const char * const restrict _s1, const int _s1Len,
        const char * const restrict _s2, const int s2Len,
        const int open, const int gap, const parasail_matrix_t *matrix)
{
    /* declare local variables */
    int32_t N = 0;
    int32_t PAD = 0;
    int32_t PAD2 = 0;
    int32_t s1Len = 0;
    int32_t s1Len_PAD = 0;
    int32_t s2Len_PAD = 0;
    int64_t * restrict s1 = NULL;
    int64_t * restrict s2B = NULL;
    int64_t * restrict _H_pr = NULL;
    int64_t * restrict _F_pr = NULL;
    int64_t * restrict s2 = NULL;
    int64_t * restrict H_pr = NULL;
    int64_t * restrict F_pr = NULL;
    parasail_result_t *result = NULL;
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int64_t NEG_LIMIT = 0;
    int64_t POS_LIMIT = 0;
    int64_t score = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vNegInf;
    __m256i vNegInf0;
    __m256i vOpen;
    __m256i vGap;
    __m256i vZero;
    __m256i vOne;
    __m256i vN;
    __m256i vNegOne;
    __m256i vI;
    __m256i vJreset;
    __m256i vMaxH;
    __m256i vEndI;
    __m256i vEndJ;
    __m256i vILimit;
    __m256i vJLimit;

    /* validate inputs */
    PARASAIL_CHECK_NULL(_s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);
    PARASAIL_CHECK_NULL(matrix);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        PARASAIL_CHECK_NULL(_s1);
        PARASAIL_CHECK_GT0(_s1Len);
    }

    /* initialize stack variables */
    N = 4; /* number of values in vector */
    PAD = N-1;
    PAD2 = PAD*2;
    s1Len = matrix->type == PARASAIL_MATRIX_TYPE_SQUARE ? _s1Len : matrix->length;
    s1Len_PAD = s1Len+PAD;
    s2Len_PAD = s2Len+PAD;
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    NEG_LIMIT = (-open < matrix->min ? INT64_MIN + open : INT64_MIN - matrix->min) + 1;
    POS_LIMIT = INT64_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi64x_rpl(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vNegInf = _mm256_set1_epi64x_rpl(NEG_LIMIT);
    vNegInf0 = _mm256_srli_si256_rpl(vNegInf, 8); /* shift in a 0 */
    vOpen = _mm256_set1_epi64x_rpl(open);
    vGap  = _mm256_set1_epi64x_rpl(gap);
    vZero = _mm256_set1_epi64x_rpl(0);
    vOne = _mm256_set1_epi64x_rpl(1);
    vN = _mm256_set1_epi64x_rpl(N);
    vNegOne = _mm256_set1_epi64x_rpl(-1);
    vI = _mm256_set_epi64x_rpl(0,1,2,3);
    vJreset = _mm256_set_epi64x_rpl(0,-1,-2,-3);
    vMaxH = vNegInf;
    vEndI = vNegInf;
    vEndJ = vNegInf;
    vILimit = _mm256_set1_epi64x_rpl(s1Len);
    vJLimit = _mm256_set1_epi64x_rpl(s2Len);

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(s1Len, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(s1Len, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_DIAG
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    s2B= parasail_memalign_int64_t(32, s2Len+PAD2);
    _H_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    _F_pr = parasail_memalign_int64_t(32, s2Len+PAD2);
    s2 = s2B+PAD; /* will allow later for negative indices */
    H_pr = _H_pr+PAD;
    F_pr = _F_pr+PAD;

    /* validate heap variables */
    if (!s2B) return NULL;
    if (!_H_pr) return NULL;
    if (!_F_pr) return NULL;

    /* convert _s1 from char to int in range 0-23 */
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        s1 = parasail_memalign_int64_t(32, s1Len+PAD);
        if (!s1) return NULL;
        for (i=0; i<s1Len; ++i) {
            s1[i] = matrix->mapper[(unsigned char)_s1[i]];
        }
        /* pad back of s1 with dummy values */
        for (i=s1Len; i<s1Len_PAD; ++i) {
            s1[i] = 0; /* point to first matrix row because we don't care */
        }
    }

    /* convert _s2 from char to int in range 0-23 */
    for (j=0; j<s2Len; ++j) {
        s2[j] = matrix->mapper[(unsigned char)_s2[j]];
    }
    /* pad front of s2 with dummy values */
    for (j=-PAD; j<0; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }
    /* pad back of s2 with dummy values */
    for (j=s2Len; j<s2Len_PAD; ++j) {
        s2[j] = 0; /* point to first matrix row because we don't care */
    }

    /* set initial values for stored row */
    for (j=0; j<s2Len; ++j) {
        H_pr[j] = 0;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad front of stored row values */
    for (j=-PAD; j<0; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }
    /* pad back of stored row values */
    for (j=s2Len; j<s2Len+PAD; ++j) {
        H_pr[j] = NEG_LIMIT;
        F_pr[j] = NEG_LIMIT;
    }

    /* iterate over query sequence */
    for (i=0; i<s1Len; i+=N) {
        __m256i vNH = vNegInf0;
        __m256i vWH = vNegInf0;
        __m256i vE = vNegInf;
        __m256i vF = vNegInf;
        __m256i vJ = vJreset;
        const int * const restrict matrow0 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+0] : ((i+0 >= s1Len) ? s1Len-1 : i+0))];
        const int * const restrict matrow1 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+1] : ((i+1 >= s1Len) ? s1Len-1 : i+1))];
        const int * const restrict matrow2 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+2] : ((i+2 >= s1Len) ? s1Len-1 : i+2))];
        const int * const restrict matrow3 = &matrix->matrix[matrix->size * ((matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) ? s1[i+3] : ((i+3 >= s1Len) ? s1Len-1 : i+3))];
        __m256i vIltLimit = _mm256_cmplt_epi64_rpl(vI, vILimit);
        /* iterate over database sequence */
        for (j=0; j<s2Len+PAD; ++j) {
            __m256i vMat;
            __m256i vNWH = vNH;
            vNH = _mm256_srli_si256_rpl(vWH, 8);
            vNH = _mm256_insert_epi64_rpl(vNH, H_pr[j], 3);
            vF = _mm256_srli_si256_rpl(vF, 8);
            vF = _mm256_insert_epi64_rpl(vF, F_pr[j], 3);
            vF = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vNH, vOpen),
                    _mm256_sub_epi64(vF, vGap));
            vE = _mm256_max_epi64_rpl(
                    _mm256_sub_epi64(vWH, vOpen),
                    _mm256_sub_epi64(vE, vGap));
            vMat = _mm256_set_epi64x_rpl(
                    matrow0[s2[j-0]],
                    matrow1[s2[j-1]],
                    matrow2[s2[j-2]],
                    matrow3[s2[j-3]]
                    );
            vNWH = _mm256_add_epi64(vNWH, vMat);
            vWH = _mm256_max_epi64_rpl(vNWH, vE);
            vWH = _mm256_max_epi64_rpl(vWH, vF);
            vWH = _mm256_max_epi64_rpl(vWH, vZero);
            /* as minor diagonal vector passes across the j=-1 boundary,
             * assign the appropriate boundary conditions */
            {
                __m256i cond = _mm256_cmpeq_epi64(vJ,vNegOne);
                vWH = _mm256_andnot_si256(cond, vWH);
                vF = _mm256_blendv_epi8(vF, vNegInf, cond);
                vE = _mm256_blendv_epi8(vE, vNegInf, cond);
            }
            /* cannot start checking sat until after J clears boundary */
            if (j > PAD) {
                vSaturationCheckMin = _mm256_min_epi64_rpl(vSaturationCheckMin, vWH);
                vSaturationCheckMax = _mm256_max_epi64_rpl(vSaturationCheckMax, vWH);
            }
#ifdef PARASAIL_TABLE
            arr_store_si256(result->tables->score_table, vWH, i, s1Len, j, s2Len);
#endif
#ifdef PARASAIL_ROWCOL
            arr_store_rowcol(result->rowcols->score_row, result->rowcols->score_col, vWH, i, s1Len, j, s2Len);
#endif
            H_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vWH,0);
            F_pr[j-3] = (int64_t)_mm256_extract_epi64_rpl(vF,0);
            /* as minor diagonal vector passes across table, extract
             * max values within the i,j bounds */
            {
                __m256i cond_valid_J = _mm256_and_si256(
                        _mm256_cmpgt_epi64(vJ, vNegOne),
                        _mm256_cmplt_epi64_rpl(vJ, vJLimit));
                __m256i cond_valid_IJ = _mm256_and_si256(cond_valid_J, vIltLimit);
                __m256i cond_eq = _mm256_cmpeq_epi64(vWH, vMaxH);
                __m256i cond_max = _mm256_cmpgt_epi64(vWH, vMaxH);
                __m256i cond_all = _mm256_and_si256(cond_max, cond_valid_IJ);
                __m256i cond_Jlt = _mm256_cmplt_epi64_rpl(vJ, vEndJ);
                vMaxH = _mm256_blendv_epi8(vMaxH, vWH, cond_all);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
                cond_all = _mm256_and_si256(cond_Jlt, cond_eq);
                cond_all = _mm256_and_si256(cond_all, cond_valid_IJ);
                vEndI = _mm256_blendv_epi8(vEndI, vI, cond_all);
                vEndJ = _mm256_blendv_epi8(vEndJ, vJ, cond_all);
            }
            vJ = _mm256_add_epi64(vJ, vOne);
        }
        vI = _mm256_add_epi64(vI, vN);
    }

    /* alignment ending position */
    {
        int64_t *t = (int64_t*)&vMaxH;
        int64_t *i = (int64_t*)&vEndI;
        int64_t *j = (int64_t*)&vEndJ;
        int32_t k;
        for (k=0; k<N; ++k, ++t, ++i, ++j) {
            if (*t > score) {
                score = *t;
                end_query = *i;
                end_ref = *j;
            }
            else if (*t == score) {
                if (*j < end_ref) {
                    end_query = *i;
                    end_ref = *j;
                }
                else if (*j == end_ref && *i < end_query) {
                    end_query = *i;
                    end_ref = *j;
                }
            }
        }
    }

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi64_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi64(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(_F_pr);
    parasail_free(_H_pr);
    parasail_free(s2B);
    if (matrix->type == PARASAIL_MATRIX_TYPE_SQUARE) {
        parasail_free(s1);
    }

    return result;
}